

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void __thiscall GusteauChapter3UI::Run(GusteauChapter3UI *this,ApplicationContextBase *ac)

{
  Blackboard *b;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  bool bVar3;
  int id;
  TypedData *d;
  int i;
  long lVar4;
  double dVar5;
  char buff_1 [256];
  
  ImGui::Text("Hello Chapter 3");
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("Quit",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "quit",0);
  }
  ImGui::InputText("###value",Run::buff,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("Push",(ImVec2 *)buff_1);
  if (bVar3) {
    dVar5 = atof(Run::buff);
    b = (Blackboard *)
        ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
        super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    d = (TypedData *)operator_new(0x18);
    (d->type)._M_target = (type_info *)&float::typeinfo;
    d->_vptr_TypedData = (_func_int **)&PTR__TypedData_001df858;
    *(float *)&d[1]._vptr_TypedData = (float)dVar5;
    id = blackboard_new_entry(b,d);
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "push_value",id);
  }
  ImGui::SameLine(0.0,-1.0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("Pop",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "pop_value",0);
  }
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("+",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "add",0);
  }
  ImGui::SameLine(0.0,-1.0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("-",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "subtract",0);
  }
  ImGui::SameLine(0.0,-1.0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("*",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "multiply",0);
  }
  ImGui::SameLine(0.0,-1.0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("/",(ImVec2 *)buff_1);
  if (bVar3) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             "divide",0);
  }
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("Undo",(ImVec2 *)buff_1);
  if (bVar3) {
    Journal::undo((Journal *)&ac[2].join_now);
  }
  ImGui::SameLine(0.0,-1.0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  bVar3 = ImGui::Button("Redo",(ImVec2 *)buff_1);
  if (bVar3) {
    Journal::redo((Journal *)&ac[2].join_now);
  }
  ImGui::TextUnformatted("------ STACK ------",(char *)0x0);
  p_Var1 = ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar2 = ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (lVar4 = 0; (long)p_Var1 - (long)peVar2 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    sprintf(buff_1,"%f",
            (double)*(float *)((long)&(ac[1].ui.
                                       super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->_vptr_UIContext + lVar4 * 4));
    ImGui::TextUnformatted(buff_1,(char *)0x0);
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto app = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 3");
        if (ImGui::Button("Quit"))
        {
            csp_emit(app->csp, "quit", 0);
        }


        static char buff[256];
        ImGui::InputText("###value", buff, sizeof(buff));
        if (ImGui::Button("Push"))
        {
            float v = static_cast<float>(atof(buff));
            int id = blackboard_new_entry(app->blackboard, new Data<float>(v));
            csp_emit(app->csp, "push_value", id);
        }
        ImGui::SameLine();
        if (ImGui::Button("Pop"))
            csp_emit(app->csp, "pop_value", 0);

        if (ImGui::Button("+"))
            csp_emit(app->csp, "add", 0);
        ImGui::SameLine();
        if (ImGui::Button("-"))
            csp_emit(app->csp, "subtract", 0);
        ImGui::SameLine();
        if (ImGui::Button("*"))
            csp_emit(app->csp, "multiply", 0);
        ImGui::SameLine();
        if (ImGui::Button("/"))
            csp_emit(app->csp, "divide", 0);

        if (ImGui::Button("Undo"))
        {
            app->journal.undo();
        }
        ImGui::SameLine();
        if (ImGui::Button("Redo"))
        {
            app->journal.redo();
        }

        ImGui::TextUnformatted("------ STACK ------");
        size_t sz = app->value_stack.size();
        for (auto i = 0; i < sz; ++i)
        {
            char buff[256];
            sprintf(buff, "%f", app->value_stack[i]);
            ImGui::TextUnformatted(buff);
        }
    }